

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane.c++
# Opt level: O3

Maybe<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> __thiscall
capnp::MembraneHook::whenMoreResolved(MembraneHook *this)

{
  OwnPromiseNode OVar1;
  PromiseArenaMember *node;
  ClientHook *pCVar2;
  byte bVar3;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>_2
  extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>_2
  extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>_2
  extraout_RDX_01;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>_2
  extraout_RDX_02;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>_2
  extraout_RDX_03;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>_2
  aVar4;
  long in_RSI;
  Maybe<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> MVar5;
  void *continuationTracePtr;
  anon_class_1_0_00000001_for_func local_81;
  byte local_80;
  OwnPromiseNode local_78;
  PromiseArenaMember *local_70;
  anon_class_8_1_8991fb9c_for_func local_68;
  OwnPromiseNode local_60;
  SourceLocation local_58;
  Own<capnp::ClientHook,_std::nullptr_t> local_40;
  PromiseArenaMember *local_30;
  
  if (*(long **)(in_RSI + 0x50) == (long *)0x0) {
    (**(code **)(**(long **)(in_RSI + 0x28) + 0x18))(&local_58);
    local_80 = (byte)local_58.fileName;
    if ((byte)local_58.fileName == 1) {
      local_78.ptr = (PromiseNode *)local_58.function;
      (**(code **)(**(long **)(in_RSI + 0x38) + 0x18))();
      local_68.this._0_1_ = (byte)local_58.fileName;
      bVar3 = (byte)local_58.fileName;
      if ((byte)local_58.fileName != 0) {
        local_60.ptr = (PromiseNode *)local_58.function;
        local_58.fileName =
             (char *)kj::_::
                     SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/membrane.c++:505:48)>
                     ::anon_class_1_0_00000001_for_func::operator();
        kj::_::PromiseDisposer::
        appendPromise<kj::_::SimpleTransformPromiseNode<void,capnp::MembraneHook::whenMoreResolved()::_lambda()_1_>,kj::_::PromiseDisposer,capnp::MembraneHook::whenMoreResolved()::_lambda()_1_,void*&>
                  ((PromiseDisposer *)&local_70,&local_60,&local_81,&local_58.fileName);
        local_58.fileName =
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/membrane.c++"
        ;
        local_58.function = "whenMoreResolved";
        local_58.lineNumber = 0x1f9;
        local_58.columnNumber = 0x13;
        kj::_::PromiseDisposer::
        appendPromise<kj::_::ExclusiveJoinPromiseNode,kj::_::PromiseDisposer,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::SourceLocation&>
                  ((PromiseDisposer *)&local_30,&local_78,
                   (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_70,&local_58);
        OVar1.ptr = local_78.ptr;
        local_78.ptr = (PromiseNode *)local_30;
        if (&(OVar1.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
          kj::_::PromiseDisposer::dispose(&(OVar1.ptr)->super_PromiseArenaMember);
        }
        node = local_70;
        if (local_70 != (PromiseArenaMember *)0x0) {
          local_70 = (PromiseArenaMember *)0x0;
          kj::_::PromiseDisposer::dispose(node);
        }
        bVar3 = (byte)local_68.this;
      }
      OVar1.ptr = local_60.ptr;
      if (((bVar3 & 1) != 0) &&
         (&(local_60.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0)) {
        local_60.ptr = (PromiseNode *)0x0;
        kj::_::PromiseDisposer::dispose(&(OVar1.ptr)->super_PromiseArenaMember);
      }
      local_58.fileName =
           (char *)kj::_::
                   SimpleTransformPromiseNode<kj::Own<capnp::ClientHook,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/membrane.c++:510:27)>
                   ::anon_class_8_1_8991fb9c_for_func::operator();
      kj::_::PromiseDisposer::
      appendPromise<kj::_::SimpleTransformPromiseNode<kj::Own<capnp::ClientHook,decltype(nullptr)>,capnp::MembraneHook::whenMoreResolved()::_lambda(kj::Own<capnp::ClientHook,decltype(nullptr)>&&)_1_>,kj::_::PromiseDisposer,capnp::MembraneHook::whenMoreResolved()::_lambda(kj::Own<capnp::ClientHook,decltype(nullptr)>&&)_1_,void*&>
                ((PromiseDisposer *)&(this->super_ClientHook).brand,&local_78,&local_68,
                 &local_58.fileName);
      *(undefined1 *)&(this->super_ClientHook)._vptr_ClientHook = 1;
      aVar4 = extraout_RDX_02;
    }
    else {
      *(undefined1 *)&(this->super_ClientHook)._vptr_ClientHook = 0;
      aVar4 = extraout_RDX_01;
    }
    OVar1.ptr = local_78.ptr;
    if (((local_80 & 1) != 0) &&
       (&(local_78.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0)) {
      local_78.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(OVar1.ptr)->super_PromiseArenaMember);
      aVar4 = extraout_RDX_03;
    }
  }
  else {
    (**(code **)(**(long **)(in_RSI + 0x50) + 0x20))(&local_40);
    kj::_::PromiseDisposer::
    alloc<kj::_::ImmediatePromiseNode<kj::Own<capnp::ClientHook,decltype(nullptr)>>,kj::_::PromiseDisposer,kj::Own<capnp::ClientHook,decltype(nullptr)>>
              ((PromiseDisposer *)&(this->super_ClientHook).brand,&local_40);
    pCVar2 = local_40.ptr;
    *(undefined1 *)&(this->super_ClientHook)._vptr_ClientHook = 1;
    aVar4 = extraout_RDX;
    if (local_40.ptr != (ClientHook *)0x0) {
      local_40.ptr = (ClientHook *)0x0;
      (**(local_40.disposer)->_vptr_Disposer)
                (local_40.disposer,
                 (_func_int *)((long)&pCVar2->_vptr_ClientHook + (long)pCVar2->_vptr_ClientHook[-2])
                );
      aVar4 = extraout_RDX_00;
    }
  }
  MVar5.ptr.field_1 = aVar4;
  MVar5.ptr._0_8_ = this;
  return (Maybe<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>)MVar5.ptr;
}

Assistant:

kj::Maybe<kj::Promise<kj::Own<ClientHook>>> whenMoreResolved() override {
    KJ_IF_SOME(r, resolved) {
      return kj::Promise<kj::Own<ClientHook>>(r.get()->addRef());
    }

    KJ_IF_SOME(promise, inner->whenMoreResolved()) {
      KJ_IF_SOME(r, policy->onRevoked()) {
        promise = promise.exclusiveJoin(r.then([]() -> kj::Own<ClientHook> {
          KJ_FAIL_REQUIRE("onRevoked() promise resolved; it should only reject");
        }));
      }

      return promise.then([this](kj::Own<ClientHook>&& newInner) {
        // There's a chance resolved was set by getResolved() or a concurrent whenMoreResolved()
        // while we yielded the event loop. If the inner ClientHook is maintaining the contract,
        // then resolved would already be set to newInner after wrapping in a MembraneHook.
        KJ_IF_SOME(r, resolved) {
          return r->addRef();
        } else {
          return resolved.emplace(wrap(*newInner, *policy, reverse))->addRef();
        }
      });
    } else {
      return kj::none;
    }
  }